

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall
dlib::perspective_display::on_wheel_down(perspective_display *this,unsigned_long param_1)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  matrix<double,_3L,_3L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *pmVar7;
  matrix<double,_3L,_3L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
  *pmVar8;
  long r;
  long lVar9;
  long lVar10;
  ulong num_pixels_;
  vector<double,_3L> local_128;
  vector<double,_3L> local_108;
  vector<double,_3L> local_e8;
  camera_transform local_c8;
  
  lVar9 = *(this->super_drawable).lastx;
  lVar10 = *(this->super_drawable).lasty;
  lVar2 = (this->super_drawable).rect.l;
  lVar3 = (this->super_drawable).rect.t;
  lVar4 = (this->super_drawable).rect.r;
  lVar5 = (this->super_drawable).rect.b;
  if ((((lVar10 <= lVar5 && lVar9 <= lVar4) && (lVar3 <= lVar10 && lVar2 <= lVar9)) &&
      ((this->super_drawable).hidden == false)) && ((this->super_drawable).enabled == true)) {
    local_e8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         (this->tform).camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    local_108.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         (this->tform).camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    local_e8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         (local_e8.
          super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[2] -
         local_108.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2]) * 0.1 +
         local_e8.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    local_e8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         (this->tform).camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    local_e8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         (this->tform).camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    local_108.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         (this->tform).camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    local_108.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         (this->tform).camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    local_e8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         (local_e8.
          super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[0] -
         local_108.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0]) * 0.1 +
         local_e8.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    local_e8.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         (local_e8.
          super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
          .data.data[1] -
         local_108.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1]) * 0.1 +
         local_e8.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    local_128.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         (this->tform).camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    local_128.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         (this->tform).camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    local_128.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         (this->tform).camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    uVar6 = (lVar4 - lVar2) + 1;
    num_pixels_ = (lVar5 - lVar3) + 1;
    if (uVar6 <= num_pixels_) {
      num_pixels_ = uVar6;
    }
    camera_transform::camera_transform
              (&local_c8,&local_e8,&local_108,&local_128,(this->tform).camera_field_of_view,
               num_pixels_);
    (this->tform).camera_pos.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         local_c8.camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    (this->tform).camera_pos.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         local_c8.camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    (this->tform).camera_pos.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         local_c8.camera_pos.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    (this->tform).camera_looking_at.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         local_c8.camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    (this->tform).camera_looking_at.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         local_c8.camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    (this->tform).camera_looking_at.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         local_c8.camera_looking_at.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    (this->tform).camera_up_direction.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[0] =
         local_c8.camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[0];
    (this->tform).camera_up_direction.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[1] =
         local_c8.camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[1];
    (this->tform).camera_up_direction.
    super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
    .data.data[2] =
         local_c8.camera_up_direction.
         super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
         .data.data[2];
    (this->tform).camera_field_of_view = local_c8.camera_field_of_view;
    (this->tform).num_pixels = local_c8.num_pixels;
    pmVar7 = &(this->tform).proj;
    pmVar8 = &local_c8.proj;
    lVar9 = 0;
    do {
      lVar10 = 0;
      do {
        dVar1 = (pmVar7->data).data[lVar10];
        (pmVar7->data).data[lVar10] = (pmVar8->data).data[lVar10];
        (pmVar8->data).data[lVar10] = dVar1;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      lVar9 = lVar9 + 1;
      pmVar8 = (matrix<double,_3L,_3L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *)((pmVar8->data).data + 3);
      pmVar7 = (matrix<double,_3L,_3L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                *)((pmVar7->data).data + 3);
    } while (lVar9 != 3);
    (this->tform).dist_scale = local_c8.dist_scale;
    (this->tform).width = local_c8.width;
    base_window::invalidate_rectangle
              (&((this->super_drawable).parent)->super_base_window,&(this->super_drawable).rect);
  }
  return;
}

Assistant:

void perspective_display::
    on_wheel_down (
        unsigned long //state
    )
    {
        if (rect.contains(lastx,lasty) == false || hidden || !enabled)
            return;

        const double alpha = 0.10;
        const vector<double> delta = alpha*(tform.get_camera_pos() - tform.get_camera_looking_at());
        tform = camera_transform(
            tform.get_camera_pos() + delta,
            tform.get_camera_looking_at(),
            tform.get_camera_up_direction(),
            tform.get_camera_field_of_view(),
            std::min(rect.width(),rect.height()));
        parent.invalidate_rectangle(rect);
    }